

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

int listincludes(char *list,char *needle,int needlelen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *end;
  char *start;
  char *s;
  int local_54;
  char *local_48;
  char *local_40;
  char *local_38;
  
  iVar3 = 0;
  local_38 = list;
  do {
    bVar1 = parselist(&local_38,&local_40,&local_48,&listquotestart,&listquoteend);
    if (!bVar1) {
      return -1;
    }
    iVar2 = (int)local_48 - (int)local_40;
    if ((iVar2 == needlelen) && (iVar2 = strncmp(needle,local_40,(long)iVar2), iVar2 == 0)) {
      bVar1 = false;
      local_54 = iVar3;
    }
    else {
      iVar3 = iVar3 + 1;
      bVar1 = true;
    }
  } while (bVar1);
  return local_54;
}

Assistant:

int listincludes(const char *list, const char *needle, int needlelen)
{
    int offset = 0;
    for(const char *s = list, *start, *end; parselist(s, start, end);)
    {
        int len = end - start;
        if(needlelen == len && !strncmp(needle, start, len)) return offset;
        offset++;
    }
    return -1;
}